

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::root_path(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  path local_40;
  
  root_name(__return_storage_ptr__,this);
  root_directory(&local_40,this);
  paVar1 = &local_40.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.m_pathname._M_dataplus._M_p,
                    local_40.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_40.m_pathname._M_string_length != 0) {
    root_directory(&local_40,this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_pathname._M_dataplus._M_p,
                      local_40.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path  path::root_path() const
  { 
    path temp(root_name());
    if (!root_directory().empty()) temp.m_pathname += root_directory().c_str();
    return temp;
  }